

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.cpp
# Opt level: O2

rbtree_node_base * eastl::RBTreeRotateLeft(rbtree_node_base *pNode,rbtree_node_base *pNodeRoot)

{
  rbtree_node_base *prVar1;
  this_type *ptVar2;
  rbtree_node_base *prVar3;
  
  prVar1 = pNode->mpNodeRight;
  ptVar2 = prVar1->mpNodeLeft;
  pNode->mpNodeRight = ptVar2;
  if (ptVar2 != (this_type *)0x0) {
    ptVar2->mpNodeParent = pNode;
  }
  ptVar2 = pNode->mpNodeParent;
  prVar1->mpNodeParent = ptVar2;
  prVar3 = prVar1;
  if (pNode != pNodeRoot) {
    (&ptVar2->mpNodeRight)[ptVar2->mpNodeLeft == pNode] = prVar1;
    prVar3 = pNodeRoot;
  }
  prVar1->mpNodeLeft = pNode;
  pNode->mpNodeParent = prVar1;
  return prVar3;
}

Assistant:

rbtree_node_base* RBTreeRotateLeft(rbtree_node_base* pNode, rbtree_node_base* pNodeRoot)
    {
        rbtree_node_base* const pNodeTemp = pNode->mpNodeRight;

        pNode->mpNodeRight = pNodeTemp->mpNodeLeft;

        if(pNodeTemp->mpNodeLeft)
            pNodeTemp->mpNodeLeft->mpNodeParent = pNode;
        pNodeTemp->mpNodeParent = pNode->mpNodeParent;
        
        if(pNode == pNodeRoot)
            pNodeRoot = pNodeTemp;
        else if(pNode == pNode->mpNodeParent->mpNodeLeft)
            pNode->mpNodeParent->mpNodeLeft = pNodeTemp;
        else
            pNode->mpNodeParent->mpNodeRight = pNodeTemp;

        pNodeTemp->mpNodeLeft = pNode;
        pNode->mpNodeParent = pNodeTemp;

        return pNodeRoot;
    }